

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoncentralRelativeAdapter.cpp
# Opt level: O3

void __thiscall
opengv::relative_pose::NoncentralRelativeAdapter::NoncentralRelativeAdapter
          (NoncentralRelativeAdapter *this,bearingVectors_t *bearingVectors1,
          bearingVectors_t *bearingVectors2,camCorrespondences_t *camCorrespondences1,
          camCorrespondences_t *camCorrespondences2,translations_t *camOffsets,
          rotations_t *camRotations,translation_t *t12,rotation_t *R12)

{
  pointer pMVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  rotations_t *in_stack_00000008;
  
  (this->super_RelativeAdapterBase)._vptr_RelativeAdapterBase =
       (_func_int **)&PTR__RelativeAdapterBase_00263bc8;
  pMVar1 = (camRotations->
           super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->super_RelativeAdapterBase)._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)(camRotations->
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
  (this->super_RelativeAdapterBase)._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)pMVar1;
  (this->super_RelativeAdapterBase)._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)(camRotations->
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage;
  dVar2 = (t12->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [1];
  dVar3 = (t12->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [2];
  dVar4 = t12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0];
  dVar5 = t12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [1];
  dVar6 = t12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2];
  dVar7 = t12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0];
  dVar8 = t12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [1];
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (t12->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0]
  ;
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = dVar2;
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = dVar3;
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = dVar4;
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = dVar5;
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = dVar6;
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = dVar7;
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = dVar8;
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       t12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
  ;
  (this->super_RelativeAdapterBase)._vptr_RelativeAdapterBase =
       (_func_int **)&PTR__NoncentralRelativeAdapter_00263b40;
  this->_bearingVectors1 = bearingVectors1;
  this->_bearingVectors2 = bearingVectors2;
  this->_camCorrespondences1 = camCorrespondences1;
  this->_camCorrespondences2 = camCorrespondences2;
  this->_camOffsets = camOffsets;
  this->_camRotations = in_stack_00000008;
  return;
}

Assistant:

opengv::relative_pose::NoncentralRelativeAdapter::NoncentralRelativeAdapter(
    const bearingVectors_t & bearingVectors1,
    const bearingVectors_t & bearingVectors2,
    const camCorrespondences_t & camCorrespondences1,
    const camCorrespondences_t & camCorrespondences2,
    const translations_t & camOffsets,
    const rotations_t & camRotations,
    const translation_t & t12,
    const rotation_t & R12 ) :
    RelativeAdapterBase(t12,R12),
    _bearingVectors1(bearingVectors1),
    _bearingVectors2(bearingVectors2),
    _camCorrespondences1(camCorrespondences1),
    _camCorrespondences2(camCorrespondences2),
    _camOffsets(camOffsets),
    _camRotations(camRotations)
{}